

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-time-dependent.h
# Opt level: O0

void __thiscall
dynamicgraph::SignalTimeDependent<double,_int>::~SignalTimeDependent
          (SignalTimeDependent<double,_int> *this,void **vtt)

{
  void **vtt_local;
  SignalTimeDependent<double,_int> *this_local;
  
  TimeDependency<int>::~TimeDependency(&this->super_TimeDependency<int>);
  return;
}

Assistant:

virtual ~SignalTimeDependent() {}